

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O1

adios2_error
adios2_inquire_group_variables
          (adios2_variable ***variables,char *full_prefix,size_t *size,adios2_io *io)

{
  adios2_io *paVar1;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  adios2_variable **ppaVar5;
  const_iterator cVar6;
  Variable *pVVar7;
  _Rb_tree_node_base *p_Var8;
  long *plVar9;
  adios2_variable **ppaVar10;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> curr;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  adios2_variable ***local_80;
  adios2_io *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"for adios2_io, in call to adios2_inquire_all_variables","");
  adios2::helper::CheckForNullptr<adios2_io>(io,&local_50);
  local_80 = variables;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_78 = io;
  this = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          *)adios2::core::IO::GetVariables_abi_cxx11_();
  local_b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b0._M_impl.super__Rb_tree_header._M_header;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
  sVar2 = strlen(full_prefix);
  plVar9 = *(long **)(this + 0x10);
  if (plVar9 != (long *)0x0) {
    do {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_70,plVar9[1],plVar9[2] + plVar9[1])
      ;
      if (sVar2 < local_70._M_string_length) {
        strlen(full_prefix);
        lVar3 = std::__cxx11::string::find((char *)&local_70,(ulong)full_prefix,0);
        if ((lVar3 == 0) &&
           (uVar4 = std::__cxx11::string::rfind((char *)&local_70,0x12979f,0xffffffffffffffff),
           uVar4 <= sVar2)) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_b0,&local_70);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      plVar9 = (long *)*plVar9;
    } while (plVar9 != (long *)0x0);
  }
  *size = local_b0._M_impl.super__Rb_tree_header._M_node_count;
  ppaVar5 = (adios2_variable **)calloc(local_b0._M_impl.super__Rb_tree_header._M_node_count,8);
  paVar1 = local_78;
  ppaVar10 = ppaVar5;
  p_Var8 = local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_b0._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_b0._M_impl.super__Rb_tree_header) {
    do {
      cVar6 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(this,(key_type *)(p_Var8 + 1));
      switch(*(undefined4 *)
              (*(long *)((long)cVar6.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_true>
                               ._M_cur + 0x28) + 0x28)) {
      case 1:
        pVVar7 = adios2::core::IO::InquireVariable<signed_char>((string *)paVar1);
        break;
      case 2:
        pVVar7 = adios2::core::IO::InquireVariable<short>((string *)paVar1);
        break;
      case 3:
        pVVar7 = adios2::core::IO::InquireVariable<int>((string *)paVar1);
        break;
      case 4:
        pVVar7 = adios2::core::IO::InquireVariable<long>((string *)paVar1);
        break;
      case 5:
        pVVar7 = adios2::core::IO::InquireVariable<unsigned_char>((string *)paVar1);
        break;
      case 6:
        pVVar7 = adios2::core::IO::InquireVariable<unsigned_short>((string *)paVar1);
        break;
      case 7:
        pVVar7 = adios2::core::IO::InquireVariable<unsigned_int>((string *)paVar1);
        break;
      case 8:
        pVVar7 = adios2::core::IO::InquireVariable<unsigned_long>((string *)paVar1);
        break;
      case 9:
        pVVar7 = adios2::core::IO::InquireVariable<float>((string *)paVar1);
        break;
      case 10:
        pVVar7 = adios2::core::IO::InquireVariable<double>((string *)paVar1);
        break;
      case 0xb:
        pVVar7 = adios2::core::IO::InquireVariable<long_double>((string *)paVar1);
        break;
      case 0xc:
        pVVar7 = adios2::core::IO::InquireVariable<std::complex<float>>((string *)paVar1);
        break;
      case 0xd:
        pVVar7 = adios2::core::IO::InquireVariable<std::complex<double>>((string *)paVar1);
        break;
      case 0xe:
        pVVar7 = adios2::core::IO::InquireVariable<std::__cxx11::string>((string *)paVar1);
        break;
      case 0xf:
        pVVar7 = adios2::core::IO::InquireVariable<char>((string *)paVar1);
        break;
      default:
        goto switchD_00118221_default;
      }
      *ppaVar10 = (adios2_variable *)pVVar7;
switchD_00118221_default:
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      ppaVar10 = ppaVar10 + 1;
    } while ((_Rb_tree_header *)p_Var8 != &local_b0._M_impl.super__Rb_tree_header);
  }
  *local_80 = ppaVar5;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_b0);
  return adios2_error_none;
}

Assistant:

adios2_error adios2_inquire_group_variables(adios2_variable ***variables, const char *full_prefix,
                                            size_t *size, adios2_io *io)
{
    try
    {
        adios2::helper::CheckForNullptr(io,
                                        "for adios2_io, in call to adios2_inquire_all_variables");

        adios2::core::IO &ioCpp = *reinterpret_cast<adios2::core::IO *>(io);
        const auto &dataMap = ioCpp.GetVariables();

        // Sort the names so that we return the same order as the
        // C++, python APIs

        std::set<std::string> names;
        size_t prefix_size = strlen(full_prefix);
        for (auto &it : dataMap)
        {
            auto curr = it.first;
            if ((curr.size() > prefix_size) && (0 == curr.find(full_prefix)))
            {
                auto pos = curr.rfind("/");
                if (pos <= prefix_size)
                {
                    names.insert(curr);
                }
            }
        }

        *size = names.size();
        adios2_variable **list = (adios2_variable **)calloc(*size, sizeof(adios2_variable *));

        size_t n = 0;
        for (auto &name : names)
        {
            auto it = dataMap.find(name);
            const adios2::DataType type(it->second->m_Type);
            adios2::core::VariableBase *variable = nullptr;

            if (type == adios2::DataType::Struct)
            {
                // not supported
            }
#define declare_template_instantiation(T)                                                          \
    else if (type == adios2::helper::GetDataType<T>())                                             \
    {                                                                                              \
        variable = ioCpp.InquireVariable<T>(name);                                                 \
        list[n] = reinterpret_cast<adios2_variable *>(variable);                                   \
    }
            ADIOS2_FOREACH_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation

            n++;
        }
        *variables = list;
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_inquire_all_variables"));
    }
}